

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

qpdf_offset_t __thiscall
QPDFWriter::writeXRefStream
          (QPDFWriter *this,int xref_id,int max_id,qpdf_offset_t max_offset,trailer_e which,
          int first,int last,int size,qpdf_offset_t prev,int hint_id,qpdf_offset_t hint_offset,
          qpdf_offset_t hint_length,bool skip_compression,int linearization_pass)

{
  element_type *peVar1;
  Count *pCVar2;
  string *psVar3;
  size_type sVar4;
  bool bVar5;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> uVar6;
  int objid;
  _Alloc_hider __p;
  uint uVar7;
  uint __val;
  int iVar8;
  longlong n;
  size_type *psVar9;
  NewObject *pNVar10;
  unsigned_long_long uVar11;
  qpdf_offset_t qVar12;
  logic_error *this_00;
  long lVar13;
  QPDFWriter *this_01;
  size_t *this_02;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> link;
  PipelinePopper pp_xref;
  uint esize;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_100;
  trailer_e local_f4;
  int local_f0;
  int local_ec;
  string local_e8;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_c8;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_type local_98;
  string local_90;
  string local_70;
  string xref_data;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar2 = peVar1->pipeline;
  psVar3 = pCVar2->str;
  psVar9 = (size_type *)&pCVar2->count;
  if (psVar3 != (string *)0x0) {
    psVar9 = &psVar3->_M_string_length;
  }
  local_98 = *psVar9;
  this_01 = (QPDFWriter *)hint_length;
  local_f4 = which;
  uVar7 = bytesNeeded((QPDFWriter *)hint_length,max_offset + hint_length);
  __val = bytesNeeded(this_01,(long)max_id);
  if (__val < uVar7) {
    __val = uVar7;
  }
  this_02 = &peVar1->max_ostream_index;
  n = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(this_02);
  uVar7 = bytesNeeded((QPDFWriter *)this_02,n);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar2 = peVar1->pipeline;
  psVar3 = pCVar2->str;
  psVar9 = (size_type *)&pCVar2->count;
  if (psVar3 != (string *)0x0) {
    psVar9 = &psVar3->_M_string_length;
  }
  sVar4 = *psVar9;
  pNVar10 = ObjTable<QPDFWriter::NewObject>::operator[]
                      (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,xref_id);
  (pNVar10->xref).type = 1;
  (pNVar10->xref).field1 = sVar4;
  (pNVar10->xref).field2 = 0;
  xref_data._M_dataplus._M_p = (pointer)&xref_data.field_2;
  xref_data._M_string_length = 0;
  xref_data.field_2._M_local_buf[0] = '\0';
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pp_xref.qw = this;
  local_f0 = first;
  local_ec = xref_id;
  if ((peVar1->compress_streams == false) || (pp_xref.stack_id = 0, peVar1->qdf_mode != false)) {
    pp_xref.stack_id = 0;
    activatePipelineStack(this,&pp_xref,&xref_data);
    bVar5 = false;
  }
  else {
    (peVar1->count_buffer)._M_string_length = 0;
    *(peVar1->count_buffer)._M_dataplus._M_p = '\0';
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link);
    uVar6 = link;
    if (!skip_compression) {
      link._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
           (__uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)0x0;
      local_c0 = (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)
                 uVar6._M_t.
                 super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
                 super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
                 super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
      local_b8._M_dataplus._M_p._0_4_ = 1;
      ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_e8,
                 (action_e *)&local_c0);
      __p._M_p = local_e8._M_dataplus._M_p;
      local_e8._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::reset
                ((__uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&link,
                 (pointer)__p._M_p);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_e8);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_c0);
    }
    local_c8 = (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)
               link._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
               ._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
               super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
    link._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>)0x0;
    local_e8._M_dataplus._M_p = local_e8._M_dataplus._M_p & 0xffffffff00000000;
    ::qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
              (&local_100,(action_e *)&local_c8,(uint *)&local_e8);
    activatePipelineStack(this,&pp_xref,&local_100);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_100);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_c8);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&link);
    bVar5 = true;
  }
  do {
    if (last < first) {
      PipelinePopper::~PipelinePopper(&pp_xref);
      objid = local_ec;
      openObject(this,local_ec);
      iVar8 = local_f0;
      str._M_str = "<<";
      str._M_len = 2;
      writeString(this,str);
      str_00._M_str = "\n ";
      str_00._M_len = 2;
      writeStringQDF(this,str_00);
      str_01._M_str = " /Type /XRef";
      str_01._M_len = 0xc;
      writeString(this,str_01);
      str_02._M_str = "\n ";
      str_02._M_len = 2;
      writeStringQDF(this,str_02);
      std::__cxx11::to_string((string *)&link,xref_data._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_xref,
                     " /Length ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link);
      str_03._M_str = (char *)pp_xref.qw;
      str_03._M_len = pp_xref.stack_id;
      writeString(this,str_03);
      std::__cxx11::string::~string((string *)&pp_xref);
      std::__cxx11::string::~string((string *)&link);
      if (bVar5) {
        str_04._M_str = "\n ";
        str_04._M_len = 2;
        writeStringQDF(this,str_04);
        str_05._M_str = " /Filter /FlateDecode";
        str_05._M_len = 0x15;
        writeString(this,str_05);
        str_06._M_str = "\n ";
        str_06._M_len = 2;
        writeStringQDF(this,str_06);
        std::__cxx11::to_string(&local_e8,uVar7 + __val + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link,
                       " /DecodeParms << /Columns ",&local_e8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_xref
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link,
                       " /Predictor 12 >>");
        str_07._M_str = (char *)pp_xref.qw;
        str_07._M_len = pp_xref.stack_id;
        writeString(this,str_07);
        std::__cxx11::string::~string((string *)&pp_xref);
        std::__cxx11::string::~string((string *)&link);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      str_08._M_str = "\n ";
      str_08._M_len = 2;
      writeStringQDF(this,str_08);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_b8," /W [ 1 ",&local_70);
      std::operator+(&local_e8,&local_b8," ");
      std::__cxx11::to_string(&local_90,uVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link,
                     &local_e8,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_xref,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link," ]"
                    );
      str_09._M_str = (char *)pp_xref.qw;
      str_09._M_len = pp_xref.stack_id;
      writeString(this,str_09);
      std::__cxx11::string::~string((string *)&pp_xref);
      std::__cxx11::string::~string((string *)&link);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_70);
      if (size + -1 != last || iVar8 != 0) {
        std::__cxx11::to_string(&local_70,iVar8);
        std::operator+(&local_b8," /Index [ ",&local_70);
        std::operator+(&local_e8,&local_b8," ");
        std::__cxx11::to_string(&local_90,(last - iVar8) + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link,
                       &local_e8,&local_90);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp_xref
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&link,
                       " ]");
        str_10._M_str = (char *)pp_xref.qw;
        str_10._M_len = pp_xref.stack_id;
        writeString(this,str_10);
        std::__cxx11::string::~string((string *)&pp_xref);
        std::__cxx11::string::~string((string *)&link);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_70);
      }
      writeTrailer(this,local_f4,size,true,prev,linearization_pass);
      str_11._M_str = "\nstream\n";
      str_11._M_len = 8;
      writeString(this,str_11);
      str_12._M_str = xref_data._M_dataplus._M_p;
      str_12._M_len = xref_data._M_string_length;
      writeString(this,str_12);
      str_13._M_str = "\nendstream";
      str_13._M_len = 10;
      writeString(this,str_13);
      closeObject(this,objid);
      lVar13 = local_98 - 1;
      std::__cxx11::string::~string((string *)&xref_data);
      return lVar13;
    }
    pNVar10 = ObjTable<QPDFWriter::NewObject>::operator[]
                        (&(((this->m).
                            super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->new_obj).super_ObjTable<QPDFWriter::NewObject>,first);
    iVar8 = QPDFXRefEntry::getType(&pNVar10->xref);
    if (iVar8 == 0) {
      writeBinary(this,0,1);
      writeBinary(this,0,__val);
      writeBinary(this,0,uVar7);
    }
    else if (iVar8 == 1) {
      qVar12 = QPDFXRefEntry::getOffset(&pNVar10->xref);
      lVar13 = 0;
      if (hint_offset <= qVar12) {
        lVar13 = hint_length;
      }
      if (hint_id == first) {
        lVar13 = 0;
      }
      if (hint_id == 0) {
        lVar13 = 0;
      }
      link._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
           (qVar12 + lVar13);
      writeBinary(this,1,1);
      uVar11 = QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::convert
                         ((longlong *)&link);
      writeBinary(this,uVar11,__val);
      writeBinary(this,0,uVar7);
    }
    else {
      if (iVar8 != 2) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"invalid type writing xref stream");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      writeBinary(this,2,1);
      iVar8 = QPDFXRefEntry::getObjStreamNumber(&pNVar10->xref);
      link._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl._0_4_ = iVar8;
      uVar11 = QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::convert((int *)&link);
      writeBinary(this,uVar11,__val);
      iVar8 = QPDFXRefEntry::getObjStreamIndex(&pNVar10->xref);
      link._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl._0_4_ = iVar8;
      uVar11 = QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::convert((int *)&link);
      writeBinary(this,uVar11,uVar7);
    }
    first = first + 1;
  } while( true );
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefStream(
    int xref_id,
    int max_id,
    qpdf_offset_t max_offset,
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    bool skip_compression,
    int linearization_pass)
{
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    qpdf_offset_t space_before_zero = xref_offset - 1;

    // field 1 contains offsets and object stream identifiers
    unsigned int f1_size = std::max(bytesNeeded(max_offset + hint_length), bytesNeeded(max_id));

    // field 2 contains object stream indices
    unsigned int f2_size = bytesNeeded(QIntC::to_longlong(m->max_ostream_index));

    unsigned int esize = 1 + f1_size + f2_size;

    // Must store in xref table in advance of writing the actual data rather than waiting for
    // openObject to do it.
    m->new_obj[xref_id].xref = QPDFXRefEntry(m->pipeline->getCount());

    std::string xref_data;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        PipelinePopper pp_xref(this);
        if (compressed) {
            m->count_buffer.clear();
            auto link = pl::create<pl::String>(xref_data);
            if (!skip_compression) {
                // Write the stream dictionary for compression but don't actually compress.  This
                // helps us with computation of padding for pass 1 of linearization.
                link = pl::create<Pl_Flate>(std::move(link), Pl_Flate::a_deflate);
            }
            activatePipelineStack(
                pp_xref, pl::create<Pl_PNGFilter>(std::move(link), Pl_PNGFilter::a_encode, esize));
        } else {
            activatePipelineStack(pp_xref, xref_data);
        }

        for (int i = first; i <= last; ++i) {
            QPDFXRefEntry& e = m->new_obj[i].xref;
            switch (e.getType()) {
            case 0:
                writeBinary(0, 1);
                writeBinary(0, f1_size);
                writeBinary(0, f2_size);
                break;

            case 1:
                {
                    qpdf_offset_t offset = e.getOffset();
                    if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                        offset += hint_length;
                    }
                    writeBinary(1, 1);
                    writeBinary(QIntC::to_ulonglong(offset), f1_size);
                    writeBinary(0, f2_size);
                }
                break;

            case 2:
                writeBinary(2, 1);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamNumber()), f1_size);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamIndex()), f2_size);
                break;

            default:
                throw std::logic_error("invalid type writing xref stream");
                break;
            }
        }
    }

    openObject(xref_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /XRef");
    writeStringQDF("\n ");
    writeString(" /Length " + std::to_string(xref_data.size()));
    if (compressed) {
        writeStringQDF("\n ");
        writeString(" /Filter /FlateDecode");
        writeStringQDF("\n ");
        writeString(" /DecodeParms << /Columns " + std::to_string(esize) + " /Predictor 12 >>");
    }
    writeStringQDF("\n ");
    writeString(" /W [ 1 " + std::to_string(f1_size) + " " + std::to_string(f2_size) + " ]");
    if (!((first == 0) && (last == size - 1))) {
        writeString(
            " /Index [ " + std::to_string(first) + " " + std::to_string(last - first + 1) + " ]");
    }
    writeTrailer(which, size, true, prev, linearization_pass);
    writeString("\nstream\n");
    writeString(xref_data);
    writeString("\nendstream");
    closeObject(xref_id);
    return space_before_zero;
}